

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,float *p_scroll_v,
                       float size_avail_v,float size_contents_v,ImDrawCornerFlags rounding_corners)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [12];
  bool bVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImU32 col;
  ImGuiCol idx;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar7;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool held;
  bool hovered;
  bool local_ce;
  bool local_cd;
  float local_cc;
  ImRect local_c8;
  float local_b0;
  ImDrawCornerFlags local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  auVar19._4_60_ = in_register_00001244;
  auVar19._0_4_ = size_contents_v;
  auVar13._4_60_ = in_register_00001204;
  auVar13._0_4_ = size_avail_v;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    local_a8 = auVar19._0_16_;
    local_98 = auVar13._0_16_;
    auVar9._8_8_ = 0;
    auVar9._0_4_ = (bb_frame->Min).x;
    auVar9._4_4_ = (bb_frame->Min).y;
    auVar14._8_8_ = 0;
    auVar14._0_4_ = (bb_frame->Max).x;
    auVar14._4_4_ = (bb_frame->Max).y;
    auVar9 = vsubps_avx(auVar14,auVar9);
    local_ce = false;
    if (0.0 < auVar9._0_4_) {
      auVar14 = vmovshdup_avx(auVar9);
      fVar7 = auVar14._0_4_;
      if (0.0 < fVar7) {
        local_cc = 1.0;
        if (axis == ImGuiAxis_Y) {
          fVar1 = (GImGui->Style).FramePadding.y;
          fVar1 = fVar1 + fVar1;
          if (fVar7 < fVar1 + GImGui->FontSize) {
            auVar18._0_4_ = (fVar7 - GImGui->FontSize) / fVar1;
            auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
            if (auVar18._0_4_ < 0.0) {
              return false;
            }
            auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar18);
            local_cc = auVar14._0_4_;
            if (local_cc <= 0.0) {
              return false;
            }
          }
        }
        auVar3._0_4_ = (bb_frame->Min).x;
        auVar3._4_4_ = (bb_frame->Min).y;
        auVar3._8_4_ = (bb_frame->Max).x;
        local_c8.Max.y = (bb_frame->Max).y;
        auVar8._0_4_ = (int)((auVar9._0_4_ + -2.0) * 0.5);
        auVar8._4_4_ = (int)((auVar9._4_4_ + -2.0) * 0.5);
        auVar8._8_4_ = (int)((auVar9._8_4_ + -2.0) * 0.5);
        auVar8._12_4_ = (int)((auVar9._12_4_ + -2.0) * 0.5);
        auVar9 = vcvtdq2ps_avx(auVar8);
        auVar20._8_4_ = 3;
        auVar20._0_8_ = 0x300000003;
        auVar20._12_4_ = 3;
        auVar14 = vpcmpgtd_avx(auVar8,auVar20);
        auVar22._8_4_ = 0x80000000;
        auVar22._0_8_ = 0x8000000080000000;
        auVar22._12_4_ = 0x80000000;
        auVar15._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = auVar9._8_4_ ^ 0x80000000;
        auVar15._12_4_ = auVar9._12_4_ ^ 0x80000000;
        auVar23._8_4_ = 0xc0400000;
        auVar23._0_8_ = 0xc0400000c0400000;
        auVar23._12_4_ = 0xc0400000;
        auVar9 = vblendvps_avx(auVar15,auVar23,auVar14);
        auVar9 = vblendvps_avx(auVar9,auVar22,auVar8);
        auVar16._8_8_ = auVar9._0_8_;
        auVar16._0_8_ = auVar9._0_8_;
        auVar24._12_4_ = local_c8.Max.y;
        auVar24._0_12_ = auVar3;
        auVar14 = vsubps_avx(auVar24,auVar16);
        auVar17._0_4_ = (float)auVar3._0_4_ + auVar9._0_4_;
        auVar17._4_4_ = (float)auVar3._4_4_ + auVar9._4_4_;
        auVar17._8_4_ = (float)auVar3._8_4_ + auVar9._0_4_;
        auVar17._12_4_ = local_c8.Max.y + auVar9._4_4_;
        local_c8.Min.x = auVar14._0_4_;
        local_c8.Min.y = auVar14._4_4_;
        auVar9 = vshufpd_avx(auVar17,auVar17,1);
        if (axis == ImGuiAxis_X) {
          local_88 = ZEXT416((uint)(auVar9._0_4_ - local_c8.Min.x));
        }
        else {
          auVar9 = vsubps_avx(auVar9,auVar14);
          local_88 = vmovshdup_avx(auVar9);
        }
        auVar9 = vcmpss_avx(local_98,local_a8,2);
        auVar9 = vblendvps_avx(local_98,local_a8,auVar9);
        local_c8.Max.x = auVar17._8_4_;
        local_c8.Max.y = auVar17._12_4_;
        local_ac = rounding_corners;
        if (auVar9._0_4_ <= 0.0) {
          __assert_fail("ImMax(size_contents_v, size_avail_v) > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                        ,0x3a4,
                        "bool ImGui::ScrollbarEx(const ImRect &, ImGuiID, ImGuiAxis, float *, float, float, ImDrawCornerFlags)"
                       );
        }
        auVar9 = vmaxss_avx(auVar9,ZEXT416(0x3f800000));
        auVar9 = ZEXT416((uint)((size_avail_v / auVar9._0_4_) * local_88._0_4_));
        auVar14 = vminss_avx(local_88,auVar9);
        auVar18 = ZEXT416((uint)(GImGui->Style).GrabMinSize);
        auVar9 = vcmpss_avx(auVar9,auVar18,1);
        local_78 = vblendvps_avx(auVar14,auVar18,auVar9);
        local_ce = false;
        local_cd = false;
        ButtonBehavior(&local_c8,id,&local_cd,&local_ce,0x40000);
        auVar9 = vinsertps_avx(local_78,ZEXT416((uint)*p_scroll_v),0x1c);
        auVar24 = SUB6416(ZEXT464(0x3f800000),0);
        auVar18 = vmaxss_avx(auVar24,ZEXT416((uint)((float)local_a8._0_4_ - (float)local_98._0_4_)))
        ;
        auVar14 = vinsertps_avx(local_88,auVar18,0x10);
        auVar14 = vdivps_avx(auVar9,auVar14);
        auVar9 = vcmpps_avx(auVar14,SUB6416(ZEXT464(0x3f800000),0),1);
        auVar9 = vshufps_avx(auVar9,auVar9,0x50);
        uVar6 = vmovmskpd_avx(auVar9);
        fVar7 = 0.0;
        if ((uVar6 & 2) == 0) {
          auVar9 = vmovshdup_avx(auVar14);
          auVar9 = vminss_avx(auVar24,auVar9);
          fVar7 = auVar9._0_4_;
        }
        fVar21 = local_88._0_4_;
        fVar1 = fVar21 - local_78._0_4_;
        fVar7 = (fVar1 * fVar7) / fVar21;
        local_a8._0_4_ = fVar7;
        if (((1.0 <= local_cc) && ((uVar6 & 1) != 0)) && (local_ce != false)) {
          local_b0 = fVar1;
          local_98 = auVar14;
          local_58 = auVar18;
          if (1 < (uint)axis) {
            __assert_fail("idx <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                          ,0xe9,"float &ImVec2::operator[](size_t)");
          }
          auVar10._0_4_ =
               (*(float *)((pIVar5->IO).MouseDown + (ulong)(uint)axis * 4 + -8) -
               (&local_c8.Min.x)[(uint)axis]) / fVar21;
          auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vminss_avx(auVar24,auVar10);
          auVar9 = vcmpss_avx(auVar10,ZEXT816(0) << 0x20,1);
          local_68 = vandnps_avx(auVar9,auVar14);
          SetHoveredID(id);
          if (pIVar5->ActiveIdIsJustActivated == false) {
            fVar7 = pIVar5->ScrollbarClickDeltaToGrabCenter;
            bVar4 = false;
          }
          else if (((float)local_68._0_4_ < (float)local_a8._0_4_) ||
                  ((float)local_98._0_4_ + (float)local_a8._0_4_ < (float)local_68._0_4_)) {
            pIVar5->ScrollbarClickDeltaToGrabCenter = 0.0;
            bVar4 = true;
            fVar7 = 0.0;
          }
          else {
            fVar7 = ((float)local_68._0_4_ - (float)local_a8._0_4_) + (float)local_98._0_4_ * -0.5;
            pIVar5->ScrollbarClickDeltaToGrabCenter = fVar7;
            bVar4 = false;
          }
          auVar11._0_4_ =
               (((float)local_68._0_4_ - fVar7) - (float)local_98._0_4_ * 0.5) /
               (1.0 - (float)local_98._0_4_);
          auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
          auVar9 = vcmpss_avx(auVar11,ZEXT816(0) << 0x40,1);
          auVar9 = vandnps_avx(auVar9,auVar14);
          auVar9 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar9._0_4_ * (float)local_58._0_4_ + 0.5)));
          *p_scroll_v = auVar9._0_4_;
          auVar12._0_4_ = auVar9._0_4_ / (float)local_58._0_4_;
          auVar12._4_12_ = auVar9._4_12_;
          auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
          auVar9 = vcmpss_avx(auVar12,ZEXT816(0) << 0x40,1);
          auVar9 = vandnps_avx(auVar9,auVar14);
          local_a8._0_4_ = (local_b0 * auVar9._0_4_) / (float)local_88._0_4_;
          if (bVar4) {
            pIVar5->ScrollbarClickDeltaToGrabCenter =
                 -(float)local_98._0_4_ * 0.5 + ((float)local_68._0_4_ - (float)local_a8._0_4_);
          }
        }
        col = GetColorU32(0xe,1.0);
        idx = 0x11;
        if (local_ce == false) {
          idx = (local_cd & 1) + 0xf;
        }
        local_cc = (float)GetColorU32(idx,local_cc);
        ImDrawList::AddRectFilled
                  (pIVar2->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar2->WindowRounding,
                   local_ac);
        if (axis == ImGuiAxis_X) {
          local_40.x = (local_c8.Max.x - local_c8.Min.x) * (float)local_a8._0_4_ + local_c8.Min.x;
          local_38.x = local_40.x + (float)local_78._0_4_;
          local_40.y = local_c8.Min.y;
          local_38.y = local_c8.Max.y;
        }
        else {
          local_40.y = (local_c8.Max.y - local_c8.Min.y) * (float)local_a8._0_4_ + local_c8.Min.y;
          local_40.x = local_c8.Min.x;
          local_38.x = local_c8.Max.x;
          local_38.y = local_40.y + (float)local_78._0_4_;
        }
        ImDrawList::AddRectFilled
                  (pIVar2->DrawList,&local_40,&local_38,(ImU32)local_cc,
                   (pIVar5->Style).ScrollbarRounding,0xf);
      }
    }
  }
  else {
    local_ce = false;
  }
  return local_ce;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, float* p_scroll_v, float size_avail_v, float size_contents_v, ImDrawCornerFlags rounding_corners)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = bb.Min[axis];
        float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = IM_ROUND(scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));

        // Update values for rendering
        scroll_ratio = ImSaturate(*p_scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, rounding_corners);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}